

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_test_util.h
# Opt level: O1

char * compare_histograms(hdr_histogram *expected,hdr_histogram *actual)

{
  _Bool _Var1;
  hdr_iter actual_iter;
  hdr_iter expected_iter;
  hdr_iter local_130;
  hdr_iter local_b0;
  
  hdr_iter_init(&local_b0,expected);
  hdr_iter_init(&local_130,actual);
  do {
    _Var1 = hdr_iter_next(&local_b0);
    if (!_Var1) {
      _Var1 = compare_int64(expected->min_value,actual->min_value);
      if (!_Var1) {
        return "Min mismatch";
      }
      _Var1 = compare_int64(expected->max_value,actual->max_value);
      if (_Var1) {
        _Var1 = compare_int64(expected->total_count,actual->total_count);
        if (_Var1) {
          return (char *)0x0;
        }
        return "Total mismatch";
      }
      return "Max mismatch";
    }
    _Var1 = hdr_iter_next(&local_130);
    if (!_Var1) {
      return "Should have next";
    }
    _Var1 = compare_int64(local_b0.count,local_130.count);
  } while (_Var1);
  return "counts mismatch";
}

Assistant:

static char* compare_histograms(struct hdr_histogram* expected, struct hdr_histogram* actual)
{
    struct hdr_iter expected_iter;
    struct hdr_iter actual_iter;

    hdr_iter_init(&expected_iter, expected);
    hdr_iter_init(&actual_iter, actual);

    while (hdr_iter_next(&expected_iter))
    {
        mu_assert("Should have next", hdr_iter_next(&actual_iter));
        mu_assert("counts mismatch", compare_int64(expected_iter.count, actual_iter.count));
    }

    mu_assert("Min mismatch", compare_int64(expected->min_value, actual->min_value));
    mu_assert("Max mismatch", compare_int64(expected->max_value, actual->max_value));
    mu_assert("Total mismatch", compare_int64(expected->total_count, actual->total_count));

    return 0;
}